

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitParenthesizedDeclarator
          (SyntaxDumper *this,ParenthesizedDeclaratorSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->openParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->innerDecltor_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->closeParenTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitParenthesizedDeclarator(const ParenthesizedDeclaratorSyntax* node) override
    {
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->innerDeclarator());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }